

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_version(lys_module *module,lys_submodule *submodule,char *value,int repeat)

{
  int iVar1;
  bool bVar2;
  uint local_28;
  int ret;
  int repeat_local;
  char *value_local;
  lys_submodule *submodule_local;
  lys_module *module_local;
  
  local_28 = 0;
  if (repeat == 0) {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      if (submodule == (lys_submodule *)0x0) {
        module->field_0x40 = module->field_0x40 & 0xf1 | 2;
      }
      else {
        bVar2 = 1 < ((byte)module->field_0x40 >> 1 & 7);
        if (bVar2) {
          ly_vlog(LYE_INVER,LY_VLOG_NONE,(void *)0x0);
        }
        local_28 = (uint)bVar2;
      }
    }
    else {
      iVar1 = strcmp(value,"1.1");
      if (iVar1 == 0) {
        if (submodule == (lys_submodule *)0x0) {
          module->field_0x40 = module->field_0x40 & 0xf1 | 4;
        }
        else {
          bVar2 = ((byte)module->field_0x40 >> 1 & 7) != 2;
          if (bVar2) {
            ly_vlog(LYE_INVER,LY_VLOG_NONE,(void *)0x0);
          }
          local_28 = (uint)bVar2;
        }
      }
      else {
        ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"yang-version");
        local_28 = 1;
      }
    }
  }
  else {
    ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"yang version","module");
    local_28 = 1;
  }
  free(value);
  return local_28;
}

Assistant:

int
yang_check_version(struct lys_module *module, struct lys_submodule *submodule, char *value, int repeat)
{
    int ret = EXIT_SUCCESS;

    if (repeat) {
        LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "yang version", "module");
        ret = EXIT_FAILURE;
    } else {
        if (!strcmp(value, "1")) {
            if (submodule) {
                if (module->version > 1) {
                    LOGVAL(LYE_INVER, LY_VLOG_NONE, NULL);
                    ret = EXIT_FAILURE;
                 }
            } else {
                module->version = 1;
            }
        } else if (!strcmp(value, "1.1")) {
            if (submodule) {
                if (module->version != 2) {
                    LOGVAL(LYE_INVER, LY_VLOG_NONE, NULL);
                    ret = EXIT_FAILURE;
                }
            } else {
                module->version = 2;
            }
        } else {
            LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "yang-version");
            ret = EXIT_FAILURE;
        }
    }
    free(value);
    return ret;
}